

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  Curl_addrinfo *pCVar1;
  sockaddr *psVar2;
  char *pcVar3;
  int local_64;
  ulong uStack_60;
  int error;
  size_t ss_size;
  Curl_addrinfo *ca;
  Curl_addrinfo *calast;
  Curl_addrinfo *cafirst;
  addrinfo *aihead;
  addrinfo *ai;
  Curl_addrinfo **result_local;
  addrinfo *hints_local;
  char *servname_local;
  char *nodename_local;
  
  calast = (Curl_addrinfo *)0x0;
  ca = (Curl_addrinfo *)0x0;
  *result = (Curl_addrinfo *)0x0;
  ai = (addrinfo *)result;
  result_local = (Curl_addrinfo **)hints;
  hints_local = (addrinfo *)servname;
  servname_local = nodename;
  local_64 = getaddrinfo(nodename,servname,(addrinfo *)hints,(addrinfo **)&cafirst);
  nodename_local._4_4_ = local_64;
  if (local_64 == 0) {
    for (aihead = (addrinfo *)cafirst; aihead != (addrinfo *)0x0; aihead = aihead->ai_next) {
      pCVar1 = ca;
      if (aihead->ai_family == 2) {
        uStack_60 = 0x10;
LAB_006833be:
        if (((aihead->ai_addr != (sockaddr *)0x0) && (aihead->ai_addrlen != 0)) &&
           (uStack_60 <= aihead->ai_addrlen)) {
          pCVar1 = (Curl_addrinfo *)(*Curl_cmalloc)(0x30);
          if (pCVar1 == (Curl_addrinfo *)0x0) {
            local_64 = -10;
            break;
          }
          pCVar1->ai_flags = aihead->ai_flags;
          pCVar1->ai_family = aihead->ai_family;
          pCVar1->ai_socktype = aihead->ai_socktype;
          pCVar1->ai_protocol = aihead->ai_protocol;
          pCVar1->ai_addrlen = (curl_socklen_t)uStack_60;
          pCVar1->ai_addr = (sockaddr *)0x0;
          pCVar1->ai_canonname = (char *)0x0;
          pCVar1->ai_next = (Curl_addrinfo *)0x0;
          psVar2 = (sockaddr *)(*Curl_cmalloc)(uStack_60);
          pCVar1->ai_addr = psVar2;
          if (pCVar1->ai_addr == (sockaddr *)0x0) {
            local_64 = -10;
            (*Curl_cfree)(pCVar1);
            break;
          }
          memcpy(pCVar1->ai_addr,aihead->ai_addr,uStack_60);
          if (aihead->ai_canonname != (char *)0x0) {
            pcVar3 = (*Curl_cstrdup)(aihead->ai_canonname);
            pCVar1->ai_canonname = pcVar3;
            if (pCVar1->ai_canonname == (char *)0x0) {
              local_64 = -10;
              (*Curl_cfree)(pCVar1->ai_addr);
              (*Curl_cfree)(pCVar1);
              break;
            }
          }
          if (calast == (Curl_addrinfo *)0x0) {
            calast = pCVar1;
          }
          if (ca != (Curl_addrinfo *)0x0) {
            ca->ai_next = pCVar1;
          }
        }
      }
      else if (aihead->ai_family == 10) {
        uStack_60 = 0x1c;
        goto LAB_006833be;
      }
      ca = pCVar1;
    }
    if (cafirst != (Curl_addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)cafirst);
    }
    if (local_64 == 0) {
      if (calast == (Curl_addrinfo *)0x0) {
        local_64 = -2;
      }
    }
    else {
      Curl_freeaddrinfo(calast);
      calast = (Curl_addrinfo *)0x0;
    }
    *(Curl_addrinfo **)ai = calast;
    nodename_local._4_4_ = local_64;
  }
  return nodename_local._4_4_;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  Curl_addrinfo *cafirst = NULL;
  Curl_addrinfo *calast = NULL;
  Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {

    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if((ai->ai_addr == NULL) || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(Curl_addrinfo));
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = malloc(ss_size);
    if(!ca->ai_addr) {
      error = EAI_MEMORY;
      free(ca);
      break;
    }
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(ai->ai_canonname != NULL) {
      ca->ai_canonname = strdup(ai->ai_canonname);
      if(!ca->ai_canonname) {
        error = EAI_MEMORY;
        free(ca->ai_addr);
        free(ca);
        break;
      }
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}